

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

void CreateDamageFunction
               (PClassActor *info,AActor *defaults,FxExpression *id,bool fromDecorate,int lumpnum)

{
  FxReturnStatement *pFVar1;
  FxIntCast *this;
  PFunction *functype;
  char *pcVar2;
  VMFunction *pVVar3;
  FString local_50;
  PFunction *local_48;
  PFunction *funcsym;
  FxReturnStatement *local_30;
  FxReturnStatement *dmg;
  int lumpnum_local;
  bool fromDecorate_local;
  FxExpression *id_local;
  AActor *defaults_local;
  PClassActor *info_local;
  
  if (id == (FxExpression *)0x0) {
    defaults->DamageFunc = (VMFunction *)0x0;
  }
  else {
    dmg._0_4_ = lumpnum;
    dmg._7_1_ = fromDecorate;
    _lumpnum_local = id;
    id_local = (FxExpression *)defaults;
    defaults_local = (AActor *)info;
    pFVar1 = (FxReturnStatement *)FxExpression::operator_new((FxExpression *)0x30,(size_t)defaults);
    this = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)defaults);
    FxIntCast::FxIntCast(this,_lumpnum_local,true,false);
    FxReturnStatement::FxReturnStatement
              (pFVar1,(FxExpression *)this,&_lumpnum_local->ScriptPosition);
    local_30 = pFVar1;
    functype = CreateAnonymousFunction((PClass *)defaults_local,(PType *)TypeSInt32,0);
    pFVar1 = local_30;
    local_48 = functype;
    pcVar2 = FName::GetChars((FName *)&defaults_local->VisibleEndPitch);
    FStringf::FStringf((FStringf *)&local_50,"%s.DamageFunction",pcVar2);
    pVVar3 = FFunctionBuildList::AddFunction
                       (&FunctionBuildList,functype,&pFVar1->super_FxExpression,&local_50,
                        (bool)(dmg._7_1_ & 1),-1,0,(int)dmg);
    *(VMFunction **)&id_local[10].isresolved = pVVar3;
    FStringf::~FStringf((FStringf *)&local_50);
  }
  return;
}

Assistant:

void CreateDamageFunction(PClassActor *info, AActor *defaults, FxExpression *id, bool fromDecorate, int lumpnum)
{
	if (id == nullptr)
	{
		defaults->DamageFunc = nullptr;
	}
	else
	{
		auto dmg = new FxReturnStatement(new FxIntCast(id, true), id->ScriptPosition);
		auto funcsym = CreateAnonymousFunction(info, TypeSInt32, 0);
		defaults->DamageFunc = FunctionBuildList.AddFunction(funcsym, dmg, FStringf("%s.DamageFunction", info->TypeName.GetChars()), fromDecorate, -1, 0, lumpnum);
	}
}